

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenConstSetValueI32(BinaryenExpressionRef expr,int32_t value)

{
  anon_union_16_5_9943fe1e_for_Literal_0 local_28;
  undefined8 local_18;
  
  if (expr->_id == ConstId) {
    local_18 = 2;
    local_28.i32 = value;
    wasm::Literal::operator=((Literal *)(expr + 1),(Literal *)&local_28.func);
    wasm::Literal::~Literal((Literal *)&local_28.func);
    return;
  }
  __assert_fail("expression->is<Const>()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xad3,"void BinaryenConstSetValueI32(BinaryenExpressionRef, int32_t)");
}

Assistant:

void BinaryenConstSetValueI32(BinaryenExpressionRef expr, int32_t value) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  static_cast<Const*>(expression)->value = Literal(value);
}